

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

bool __thiscall llvm::DWARFDie::addressRangeContainsAddress(DWARFDie *this,uint64_t Address)

{
  pointer pDVar1;
  storage_type *psVar2;
  pointer pDVar3;
  DWARFAddressRange *R;
  bool bVar4;
  bool bVar5;
  undefined1 local_40 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  
  getAddressRanges((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    *)local_40,this);
  if ((RangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
    psVar2 = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             ::getStorage((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                           *)local_40);
    pDVar1 = (psVar2->
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>).
             _M_impl.super__Vector_impl_data._M_start;
    do {
      pDVar3 = pDVar1;
      bVar5 = pDVar3 == (psVar2->
                        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = !bVar5;
      if (bVar5) break;
      pDVar1 = pDVar3 + 1;
    } while ((Address < pDVar3->LowPC) || (pDVar3->HighPC <= Address));
  }
  else {
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)&RangesOrError.field_0x18);
    consumeError((Error *)&RangesOrError.field_0x18);
    if ((long *)(RangesOrError._24_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(RangesOrError._24_8_ & 0xfffffffffffffffe) + 8))();
    }
    bVar4 = false;
  }
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
  ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             *)local_40);
  return bVar4;
}

Assistant:

bool DWARFDie::addressRangeContainsAddress(const uint64_t Address) const {
  auto RangesOrError = getAddressRanges();
  if (!RangesOrError) {
    llvm::consumeError(RangesOrError.takeError());
    return false;
  }

  for (const auto &R : RangesOrError.get())
    if (R.LowPC <= Address && Address < R.HighPC)
      return true;
  return false;
}